

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

ElabSystemTaskSymbol *
slang::ast::ElabSystemTaskSymbol::fromSyntax(Compilation *compilation,ElabSystemTaskSyntax *syntax)

{
  Token token;
  ElabSystemTaskSymbol *pEVar1;
  ElabSystemTaskKind taskKind;
  undefined1 in_stack_ffffffffffffffc8 [12];
  ElabSystemTaskKind in_stack_ffffffffffffffd4;
  SourceLocation local_28;
  
  token.info._4_4_ = in_stack_ffffffffffffffd4;
  token._0_12_ = in_stack_ffffffffffffffc8;
  SemanticFacts::getElabSystemTaskKind(token);
  local_28 = parsing::Token::location(&syntax->name);
  pEVar1 = BumpAllocator::
           emplace<slang::ast::ElabSystemTaskSymbol,slang::ast::ElabSystemTaskKind&,slang::SourceLocation>
                     (&compilation->super_BumpAllocator,
                      (ElabSystemTaskKind *)&stack0xffffffffffffffd4,&local_28);
  (pEVar1->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  return pEVar1;
}

Assistant:

ElabSystemTaskSymbol& ElabSystemTaskSymbol::fromSyntax(Compilation& compilation,
                                                       const ElabSystemTaskSyntax& syntax) {
    // Just create the symbol now. The diagnostic will be issued later
    // when someone visits the symbol and asks for it.
    auto taskKind = SemanticFacts::getElabSystemTaskKind(syntax.name);
    auto result = compilation.emplace<ElabSystemTaskSymbol>(taskKind, syntax.name.location());
    result->setSyntax(syntax);
    return *result;
}